

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<32,151>::CompactCorrelationMatrix::
print<std::back_insert_iterator<std::__cxx11::string>>
          (CompactCorrelationMatrix *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  pointer *k;
  vector<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  lines;
  ControlRecord local_78;
  vector<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_48;
  
  Type<32,_151>::CompactCorrelationMatrix::compact(&local_48,(CompactCorrelationMatrix *)this);
  local_78.
  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)*(uint *)this;
  local_78.
  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)*(uint *)(this + 4);
  local_78.
  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (long)local_48.
             super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_48.
             super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_78.
  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)0;
  local_78.
  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = 0.0;
  local_78.
  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>(&local_78,it,MAT,MF,MT);
  if (local_48.
      super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    k = (pointer *)
        local_48.
        super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
    do {
      switch(*(undefined4 *)this) {
      case 2:
        record::IntegerBase<2U,_18U>::IntegerBase
                  ((IntegerBase<2U,_18U> *)&local_78,*(uint *)((long)k + 0x1c),
                   *(uint *)&(((vector<int,_std::allocator<int>_> *)(k + 3))->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start,(vector<int,_std::allocator<int>_> *)k
                  );
        record::IntegerBase<2u,18u>::print<std::back_insert_iterator<std::__cxx11::string>>
                  ((IntegerBase<2u,18u> *)&local_78,it,MAT,MF,MT);
        break;
      case 3:
        record::IntegerBase<2U,_13U>::IntegerBase
                  ((IntegerBase<2U,_13U> *)&local_78,*(uint *)((long)k + 0x1c),
                   *(uint *)&(((vector<int,_std::allocator<int>_> *)(k + 3))->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start,(vector<int,_std::allocator<int>_> *)k
                  );
        record::IntegerBase<2u,13u>::print<std::back_insert_iterator<std::__cxx11::string>>
                  ((IntegerBase<2u,13u> *)&local_78,it,MAT,MF,MT);
        break;
      case 4:
        record::IntegerBase<4U,_11U>::IntegerBase
                  ((IntegerBase<4U,_11U> *)&local_78,*(uint *)((long)k + 0x1c),
                   *(uint *)&(((vector<int,_std::allocator<int>_> *)(k + 3))->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start,(vector<int,_std::allocator<int>_> *)k
                  );
        record::IntegerBase<4u,11u>::print<std::back_insert_iterator<std::__cxx11::string>>
                  ((IntegerBase<4u,11u> *)&local_78,it,MAT,MF,MT);
        break;
      case 5:
        record::IntegerBase<5U,_9U>::IntegerBase
                  ((IntegerBase<5U,_9U> *)&local_78,*(uint *)((long)k + 0x1c),
                   *(uint *)&(((vector<int,_std::allocator<int>_> *)(k + 3))->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start,(vector<int,_std::allocator<int>_> *)k
                  );
        record::IntegerBase<5u,9u>::print<std::back_insert_iterator<std::__cxx11::string>>
                  ((IntegerBase<5u,9u> *)&local_78,it,MAT,MF,MT);
        break;
      case 6:
        record::IntegerBase<6U,_8U>::IntegerBase
                  ((IntegerBase<6U,_8U> *)&local_78,*(uint *)((long)k + 0x1c),
                   *(uint *)&(((vector<int,_std::allocator<int>_> *)(k + 3))->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start,(vector<int,_std::allocator<int>_> *)k
                  );
        record::IntegerBase<6u,8u>::print<std::back_insert_iterator<std::__cxx11::string>>
                  ((IntegerBase<6u,8u> *)&local_78,it,MAT,MF,MT);
        break;
      default:
        goto switchD_001494b9_default;
      }
      if ((void *)local_78.
                  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.
                  super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                  super__Head_base<4UL,_long,_false>._M_head_impl != (void *)0x0) {
        operator_delete((void *)local_78.
                                super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                                .fields.
                                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                                super__Tuple_impl<2UL,_long,_long,_long,_long>.
                                super__Tuple_impl<3UL,_long,_long,_long>.
                                super__Tuple_impl<4UL,_long,_long>.
                                super__Head_base<4UL,_long,_false>._M_head_impl,
                        local_78.
                        super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                        .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Head_base<2UL,_long,_false>._M_head_impl -
                        local_78.
                        super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                        .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                        super__Head_base<4UL,_long,_false>._M_head_impl);
      }
switchD_001494b9_default:
      k = k + 4;
    } while ((pointer)k !=
             local_48.
             super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  // this code is not pretty, but the INTG records are just dumb so ...

  // compact the matrix
  auto lines = this->compact();

  // write the correlation matrix
  ControlRecord( 0., 0.,
                 this->NDIGIT(), this->NNN(),
                 lines.size(), 0 ).print( it, MAT, MF, MT );
  for ( auto& line : lines ) {

    switch ( this->NDIGIT() ) {

      case 2: { record::IntegerBase< 2, 18 >(
                    std::get< 0 >( line ),
                    std::get< 1 >( line ),
                    std::move( std::get< 2 >( line ) ) ).print( it, MAT, MF, MT );
                break; }
      case 3: { record::IntegerBase< 2, 13 >(
                    std::get< 0 >( line ),
                    std::get< 1 >( line ),
                    std::move( std::get< 2 >( line ) ) ).print( it, MAT, MF, MT );
                break; }
      case 4: { record::IntegerBase< 4, 11 >(
                    std::get< 0 >( line ),
                    std::get< 1 >( line ),
                    std::move( std::get< 2 >( line ) ) ).print( it, MAT, MF, MT );
                break; }
      case 5: { record::IntegerBase< 5, 9 >(
                    std::get< 0 >( line ),
                    std::get< 1 >( line ),
                    std::move( std::get< 2 >( line ) ) ).print( it, MAT, MF, MT );
                break; }
      case 6: { record::IntegerBase< 6, 8 >(
                    std::get< 0 >( line ),
                    std::get< 1 >( line ),
                    std::move( std::get< 2 >( line ) ) ).print( it, MAT, MF, MT );
                break; }
      default: { /* unreachable */ break; }
    }
  }
}